

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial_query.cpp
# Opt level: O1

void __thiscall create::SerialQuery::requestSensorData(SerialQuery *this)

{
  size_t in_RCX;
  non_const_lvalue<std::_Bind<void_(create::SerialQuery::*(create::SerialQuery_*,_std::_Placeholder<1>))(const_boost::system::error_code_&)>_>
  handler2;
  int in_R8D;
  _Bind<void_(create::SerialQuery::*(create::SerialQuery_*,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
  local_28;
  
  tcflush((this->super_Serial).port.impl_.implementation_.descriptor_,0);
  Serial::send(&this->super_Serial,0x148d00,(void *)0x2,in_RCX,in_R8D);
  local_28._M_f = 50000;
  boost::asio::
  basic_deadline_timer<boost::posix_time::ptime,_boost::asio::time_traits<boost::posix_time::ptime>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::expires_from_now(&this->streamRecoveryTimer,(duration_type *)&local_28);
  local_28._M_f = (offset_in_SerialQuery_to_subr)restartSensorStream;
  local_28._8_8_ = 0;
  local_28._M_bound_args.super__Tuple_impl<0UL,_create::SerialQuery_*,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_create::SerialQuery_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_create::SerialQuery_*,_std::_Placeholder<1>_>)
       (_Tuple_impl<0UL,_create::SerialQuery_*,_std::_Placeholder<1>_>)this;
  boost::asio::detail::deadline_timer_service<boost::asio::time_traits<boost::posix_time::ptime>>::
  async_wait<std::_Bind<void(create::SerialQuery::*(create::SerialQuery*,std::_Placeholder<1>))(boost::system::error_code_const&)>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
            ((deadline_timer_service<boost::asio::time_traits<boost::posix_time::ptime>> *)
             (this->streamRecoveryTimer).impl_.service_,
             &(this->streamRecoveryTimer).impl_.implementation_,&local_28,
             &(this->streamRecoveryTimer).impl_.executor_);
  return;
}

Assistant:

void SerialQuery::requestSensorData() {
    static const uint8_t requestPacket[2] = { OC_SENSORS, ID_GROUP_0 };
    // Prevents previous packet from corrupting next one
    flushInput();
    send(requestPacket, 2);
    // Automatically resend request if no response is received
    streamRecoveryTimer.expires_from_now(boost::posix_time::milliseconds(50));
    streamRecoveryTimer.async_wait(
      std::bind(&SerialQuery::restartSensorStream, this, std::placeholders::_1));
  }